

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264d_vdpu383.c
# Opt level: O2

MPP_RET vdpu383_h264d_init(void *hal,MppHalCfg *cfg)

{
  SlotHalFbcAdjCfg *pSVar1;
  MPP_RET MVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  int iVar6;
  ulong uVar7;
  
  if (hal == (void *)0x0) {
    MVar2 = MPP_OK;
    if ((hal_h264d_debug & 4) != 0) {
      MVar2 = MPP_OK;
      _mpp_log_l(4,"hal_h264d_vdpu383","input empty(%d).\n",(char *)0x0,0x27a);
    }
  }
  else {
    pvVar4 = mpp_osal_calloc("vdpu383_h264d_init",0x4d8);
    *(void **)((long)hal + 0x90) = pvVar4;
    if (pvVar4 == (void *)0x0) {
      if ((hal_h264d_debug & 1) != 0) {
        _mpp_log_l(4,"hal_h264d_vdpu383","malloc buffer error(%d).\n",(char *)0x0,0x27d);
      }
      MVar2 = MPP_ERR_MALLOC;
      if (((hal_h264d_debug & 2) != 0) &&
         (_mpp_log_l(2,"hal_h264d_vdpu383","Assertion %s failed at %s:%d\n",(char *)0x0,"0",
                     "vdpu383_h264d_init",0x27d), (mpp_debug._3_1_ & 0x10) != 0)) {
        abort();
      }
    }
    else {
      iVar6 = (uint)(*(int *)((long)hal + 0x98) != 0) * 2 + 1;
      MVar2 = mpp_buffer_get_with_tag
                        (*(MppBufferGroup *)((long)hal + 0x68),(MppBuffer *)((long)pvVar4 + 0x390),
                         (ulong)(iVar6 * 0x3000 + 0x1000),"hal_h264d_vdpu383","vdpu383_h264d_init");
      if (MPP_NOK < MVar2) {
        iVar3 = mpp_buffer_get_fd_with_caller
                          (*(MppBuffer *)((long)pvVar4 + 0x390),"vdpu383_h264d_init");
        *(int *)((long)pvVar4 + 0x398) = iVar3;
        pvVar5 = mpp_buffer_get_ptr_with_caller
                           (*(MppBuffer *)((long)pvVar4 + 0x390),"vdpu383_h264d_init");
        *(void **)((long)pvVar4 + 0x3a0) = pvVar5;
        *(undefined8 *)((long)pvVar4 + 0x3a8) = 0x100000000000;
        iVar3 = 0x3000;
        for (uVar7 = 0; (uint)(iVar6 * 4) != uVar7; uVar7 = uVar7 + 4) {
          pvVar5 = mpp_osal_calloc("vdpu383_h264d_init",0x298);
          *(void **)((long)pvVar4 + uVar7 * 4 + 0x3e0) = pvVar5;
          *(undefined4 *)((long)pvVar5 + 4) = 1;
          *(byte *)((long)pvVar5 + 8) = *(byte *)((long)pvVar5 + 8) & 0xef;
          *(uint *)((long)pvVar5 + 0xc) = *(uint *)((long)pvVar5 + 0xc) | 0x3ff;
          *(undefined4 *)((long)pvVar5 + 0x18) = 0xffffff;
          *(uint *)((long)pvVar5 + 0x24) = (*(uint *)((long)pvVar5 + 0x24) & 0xfefffefe) + 1;
          *(undefined8 *)((long)pvVar5 + 0x34) = 0xffbf9fffffedfff;
          *(ulong *)((long)pvVar5 + 0x54) =
               *(ulong *)((long)pvVar5 + 0x54) & 0xfe00f000fffff006 | (ulong)DAT_0028e580;
          *(int *)((long)pvVar4 + uVar7 + 0x3b0) = iVar3 + -0x2000;
          *(int *)((long)pvVar4 + uVar7 + 0x3bc) = iVar3 + -0x1000;
          *(int *)((long)pvVar4 + uVar7 + 0x3c8) = iVar3;
          iVar3 = iVar3 + 0x3000;
        }
        mpp_buffer_attach_dev_f
                  ("vdpu383_h264d_init",*(MppBuffer *)((long)pvVar4 + 0x390),
                   *(MppDev *)((long)hal + 0x88));
        if (*(int *)((long)hal + 0x98) == 0) {
          *(undefined8 *)((long)pvVar4 + 0x4c8) = *(undefined8 *)((long)pvVar4 + 0x3e0);
          *(undefined4 *)((long)pvVar4 + 0x408) = *(undefined4 *)((long)pvVar4 + 0x3b0);
          *(undefined4 *)((long)pvVar4 + 0x40c) = *(undefined4 *)((long)pvVar4 + 0x3bc);
          *(undefined4 *)((long)pvVar4 + 0x410) = *(undefined4 *)((long)pvVar4 + 0x3c8);
        }
        memcpy((void *)((ulong)*(uint *)((long)pvVar4 + 0x3a8) + *(long *)((long)pvVar4 + 0x3a0)),
               h264_cabac_table,0xe80);
        mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x50),SLOTS_HOR_ALIGN,
                           mpp_align_128_odd_plus_64);
        mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x50),SLOTS_VER_ALIGN,rkv_ver_align);
        mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x50),SLOTS_LEN_ALIGN,rkv_len_align);
        pSVar1 = cfg->hal_fbc_adj_cfg;
        if (pSVar1 == (SlotHalFbcAdjCfg *)0x0) {
          return MPP_OK;
        }
        pSVar1->func = vdpu383_afbc_align_calc;
        pSVar1->expand = 0x10;
        return MPP_OK;
      }
      if ((hal_h264d_debug & 4) != 0) {
        _mpp_log_l(4,"hal_h264d_vdpu383","Function error(%d).\n",(char *)0x0,0x284);
      }
    }
    vdpu383_h264d_deinit(hal);
  }
  return MVar2;
}

Assistant:

MPP_RET vdpu383_h264d_init(void *hal, MppHalCfg *cfg)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264dHalCtx_t *p_hal = (H264dHalCtx_t *)hal;

    INP_CHECK(ret, NULL == p_hal);
    (void) cfg;

    MEM_CHECK(ret, p_hal->reg_ctx = mpp_calloc_size(void, sizeof(Vdpu383H264dRegCtx)));
    Vdpu383H264dRegCtx *reg_ctx = (Vdpu383H264dRegCtx *)p_hal->reg_ctx;
    RK_U32 max_cnt = p_hal->fast_mode ? VDPU383_FAST_REG_SET_CNT : 1;
    RK_U32 i = 0;

    //!< malloc buffers
    FUN_CHECK(ret = mpp_buffer_get(p_hal->buf_group, &reg_ctx->bufs,
                                   VDPU383_INFO_BUFFER_SIZE(max_cnt)));
    reg_ctx->bufs_fd = mpp_buffer_get_fd(reg_ctx->bufs);
    reg_ctx->bufs_ptr = mpp_buffer_get_ptr(reg_ctx->bufs);
    reg_ctx->offset_cabac = VDPU383_CABAC_TAB_OFFSET;
    reg_ctx->offset_errinfo = VDPU383_ERROR_INFO_OFFSET;
    for (i = 0; i < max_cnt; i++) {
        reg_ctx->reg_buf[i].regs = mpp_calloc(Vdpu383H264dRegSet, 1);
        init_ctrl_regs(reg_ctx->reg_buf[i].regs);
        reg_ctx->offset_spspps[i] = VDPU383_SPSPPS_OFFSET(i);
        reg_ctx->offset_rps[i] = VDPU383_RPS_OFFSET(i);
        reg_ctx->offset_sclst[i] = VDPU383_SCALING_LIST_OFFSET(i);
    }

    mpp_buffer_attach_dev(reg_ctx->bufs, p_hal->dev);

    if (!p_hal->fast_mode) {
        reg_ctx->regs = reg_ctx->reg_buf[0].regs;
        reg_ctx->spspps_offset = reg_ctx->offset_spspps[0];
        reg_ctx->rps_offset = reg_ctx->offset_rps[0];
        reg_ctx->sclst_offset = reg_ctx->offset_sclst[0];
    }

    //!< copy cabac table bytes
    memcpy((char *)reg_ctx->bufs_ptr + reg_ctx->offset_cabac,
           (void *)h264_cabac_table, sizeof(h264_cabac_table));

    mpp_slots_set_prop(p_hal->frame_slots, SLOTS_HOR_ALIGN, mpp_align_128_odd_plus_64);
    mpp_slots_set_prop(p_hal->frame_slots, SLOTS_VER_ALIGN, rkv_ver_align);
    mpp_slots_set_prop(p_hal->frame_slots, SLOTS_LEN_ALIGN, rkv_len_align);

    if (cfg->hal_fbc_adj_cfg) {
        cfg->hal_fbc_adj_cfg->func = vdpu383_afbc_align_calc;
        cfg->hal_fbc_adj_cfg->expand = 16;
    }

__RETURN:
    return MPP_OK;
__FAILED:
    vdpu383_h264d_deinit(hal);

    return ret;
}